

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp.h
# Opt level: O0

void __thiscall
GF2::MP<6UL,_GF2::MOGrlex<6UL>_>::Geobucket<4UL>::Geobucket
          (Geobucket<4UL> *this,MP<6UL,_GF2::MOGrlex<6UL>_> *polyRight)

{
  reference this_00;
  Geobucket<4UL> *in_RSI;
  vector<GF2::MP<6UL,_GF2::MOGrlex<6UL>_>,_std::allocator<GF2::MP<6UL,_GF2::MOGrlex<6UL>_>_>_>
  *in_RDI;
  MOGrlex<6UL> *in_stack_ffffffffffffffa8;
  vector<GF2::MP<6UL,_GF2::MOGrlex<6UL>_>,_std::allocator<GF2::MP<6UL,_GF2::MOGrlex<6UL>_>_>_>
  *__new_size;
  vector<GF2::MP<6UL,_GF2::MOGrlex<6UL>_>,_std::allocator<GF2::MP<6UL,_GF2::MOGrlex<6UL>_>_>_>
  *this_01;
  MP<6UL,_GF2::MOGrlex<6UL>_> *in_stack_ffffffffffffffe8;
  
  this_01 = in_RDI;
  std::vector<GF2::MP<6UL,_GF2::MOGrlex<6UL>_>,_std::allocator<GF2::MP<6UL,_GF2::MOGrlex<6UL>_>_>_>
  ::vector((vector<GF2::MP<6UL,_GF2::MOGrlex<6UL>_>,_std::allocator<GF2::MP<6UL,_GF2::MOGrlex<6UL>_>_>_>
            *)0x1b7a35);
  __new_size = this_01 + 1;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1b7a48);
  std::vector<GF2::MP<6UL,_GF2::MOGrlex<6UL>_>,_std::allocator<GF2::MP<6UL,_GF2::MOGrlex<6UL>_>_>_>
  ::resize(this_01,(size_type)__new_size);
  this_00 = std::
            vector<GF2::MP<6UL,_GF2::MOGrlex<6UL>_>,_std::allocator<GF2::MP<6UL,_GF2::MOGrlex<6UL>_>_>_>
            ::operator[](in_RDI,0);
  GetOrder((MP<6UL,_GF2::MOGrlex<6UL>_> *)in_RSI);
  SetOrder(this_00,in_stack_ffffffffffffffa8);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_00,
             (value_type_conflict1 *)in_stack_ffffffffffffffa8);
  SymDiffSplice(in_RSI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

Geobucket(MP& polyRight)
		{
			_buckets.resize(1);
			_buckets[0].SetOrder(polyRight.GetOrder());
			_maxsizes.push_back(_d);
			SymDiffSplice(polyRight);
		}